

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_font_baker_memory(nk_size *temp,int *glyph_count,nk_font_config *config_list,int count)

{
  int iVar1;
  nk_rune *pnVar2;
  nk_font_config *local_40;
  nk_font_config *i;
  nk_font_config *iter;
  int total_range_count;
  int range_count;
  int count_local;
  nk_font_config *config_list_local;
  int *glyph_count_local;
  nk_size *temp_local;
  
  iter._4_4_ = 0;
  if (config_list == (nk_font_config *)0x0) {
    __assert_fail("config_list",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x3139,
                  "void nk_font_baker_memory(nk_size *, int *, struct nk_font_config *, int)");
  }
  if (glyph_count != (int *)0x0) {
    if (config_list == (nk_font_config *)0x0) {
      *temp = 0;
      *glyph_count = 0;
    }
    else {
      *glyph_count = 0;
      for (i = config_list; i != (nk_font_config *)0x0; i = i->next) {
        local_40 = i;
        do {
          if (local_40->range == (nk_rune *)0x0) {
            pnVar2 = nk_font_default_glyph_ranges();
            i->range = pnVar2;
          }
          iVar1 = nk_range_count(local_40->range);
          iter._4_4_ = iVar1 + iter._4_4_;
          iVar1 = nk_range_glyph_count(local_40->range,iVar1);
          *glyph_count = iVar1 + *glyph_count;
          local_40 = local_40->n;
        } while (local_40 != i);
      }
      *temp = (long)*glyph_count << 4;
      *temp = (long)iter._4_4_ * 0x28 + *temp;
      *temp = (long)*glyph_count * 0x1c + *temp;
      *temp = (long)count * 0x48 + *temp;
      *temp = *temp + 0x68;
      *temp = *temp + 0x10;
      *temp = *temp + 0x10;
    }
    return;
  }
  __assert_fail("glyph_count",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                ,0x313a,"void nk_font_baker_memory(nk_size *, int *, struct nk_font_config *, int)")
  ;
}

Assistant:

NK_INTERN void
nk_font_baker_memory(nk_size *temp, int *glyph_count,
    struct nk_font_config *config_list, int count)
{
    int range_count = 0;
    int total_range_count = 0;
    struct nk_font_config *iter, *i;

    NK_ASSERT(config_list);
    NK_ASSERT(glyph_count);
    if (!config_list) {
        *temp = 0;
        *glyph_count = 0;
        return;
    }
    *glyph_count = 0;
    for (iter = config_list; iter; iter = iter->next) {
        i = iter;
        do {if (!i->range) iter->range = nk_font_default_glyph_ranges();
            range_count = nk_range_count(i->range);
            total_range_count += range_count;
            *glyph_count += nk_range_glyph_count(i->range, range_count);
        } while ((i = i->n) != iter);
    }
    *temp = (nk_size)*glyph_count * sizeof(struct nk_rp_rect);
    *temp += (nk_size)total_range_count * sizeof(struct nk_tt_pack_range);
    *temp += (nk_size)*glyph_count * sizeof(struct nk_tt_packedchar);
    *temp += (nk_size)count * sizeof(struct nk_font_bake_data);
    *temp += sizeof(struct nk_font_baker);
    *temp += nk_rect_align + nk_range_align + nk_char_align;
    *temp += nk_build_align + nk_baker_align;
}